

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

int add_environment(char *key,char *val)

{
  size_t sVar1;
  size_t sVar2;
  char *__s;
  char *in_RSI;
  char *in_RDI;
  char *entry;
  size_t len;
  int n;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    if (0x1e < local_1c) {
      return 1;
    }
    if (ENV[local_1c] == (char *)0x0) break;
    local_1c = local_1c + 1;
  }
  sVar1 = strlen(in_RDI);
  sVar2 = strlen(in_RSI);
  sVar1 = sVar1 + sVar2 + 2;
  __s = (char *)malloc(sVar1);
  snprintf(__s,sVar1,"%s=%s",in_RDI,in_RSI);
  ENV[local_1c] = __s;
  return 0;
}

Assistant:

int add_environment(const char *key, const char *val)
{
    int n;
 
    for (n = 0; n < 31; n++) {
        if (!ENV[n]) {
            size_t len = strlen(key) + strlen(val) + 2;
            char *entry = malloc(len);
            snprintf(entry, len, "%s=%s", key, val);
            ENV[n] = entry;
            return 0;
        }
    }

    return 1;
}